

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclDeptFanin(SC_Man *p,SC_Timing *pTime,Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  SC_Pair *pSVar4;
  SC_Pair *pSVar5;
  SC_Pair *pSVar6;
  float fVar7;
  float fVar8;
  
  pSVar4 = p->pLoads;
  pSVar5 = p->pDepts;
  uVar2 = pFanin->Id;
  pSVar6 = p->pSlews;
  uVar3 = pObj->Id;
  if ((pTime->tsense | sc_ts_Neg) == sc_ts_Non) {
    fVar8 = pSVar5[uVar2].rise;
    fVar1 = pSVar5[uVar3].rise;
    fVar7 = Scl_LibLookup(&pTime->pCellRise,pSVar6[uVar2].rise,pSVar4[uVar3].rise);
    fVar7 = fVar7 + fVar1;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    pSVar5[uVar2].rise = fVar8;
    fVar8 = pSVar5[uVar2].fall;
    fVar1 = pSVar5[uVar3].fall;
    fVar7 = Scl_LibLookup(&pTime->pCellFall,pSVar6[uVar2].fall,pSVar4[uVar3].fall);
    fVar7 = fVar7 + fVar1;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    pSVar5[uVar2].fall = fVar8;
  }
  if ((pTime->tsense & ~sc_ts_Pos) == sc_ts_Neg) {
    fVar8 = pSVar5[uVar2].fall;
    fVar1 = pSVar5[uVar3].rise;
    fVar7 = Scl_LibLookup(&pTime->pCellRise,pSVar6[uVar2].fall,pSVar4[uVar3].rise);
    fVar7 = fVar7 + fVar1;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    pSVar5[uVar2].fall = fVar8;
    fVar8 = pSVar5[uVar2].rise;
    fVar1 = pSVar5[uVar3].fall;
    fVar7 = Scl_LibLookup(&pTime->pCellFall,pSVar6[uVar2].rise,pSVar4[uVar3].fall);
    fVar7 = fVar7 + fVar1;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    pSVar5[uVar2].rise = fVar8;
  }
  return;
}

Assistant:

static inline void Abc_SclDeptFanin( SC_Man * p, SC_Timing * pTime, Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    SC_Pair * pDepIn   = Abc_SclObjDept( p, pFanin );   // modified
    SC_Pair * pSlewIn  = Abc_SclObjSlew( p, pFanin );
    SC_Pair * pLoad    = Abc_SclObjLoad( p, pObj );
    SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
    Scl_LibPinDeparture( pTime, pDepIn, pSlewIn, pLoad, pDepOut );
}